

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSDDOMParser::startElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  DOMDocumentImpl *pDVar1;
  DOMNode *pDVar2;
  XMLBufferMgr *pXVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  AttTypes AVar7;
  DefAttTypes DVar8;
  uint uVar9;
  XMLCh *pXVar10;
  XMLCh *pXVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLAttr *this_00;
  DOMAttr *attr_00;
  long *plVar12;
  DOMNodeIDMap *this_01;
  undefined4 extraout_var_03;
  ulong uVar13;
  XMLAttDef *this_02;
  undefined4 extraout_var_04;
  long *plVar14;
  long *plVar15;
  DOMDocument *local_180;
  DOMAttr *remAttr_1;
  XMLCh *namespaceURI_1;
  uint uriId;
  int colonPos;
  XMLBuffer *prefixBuf;
  XMLBufBid bbPrefixQName;
  XMLCh *qualifiedName;
  ulong uStack_c0;
  DefAttTypes defType;
  XMLSize_t i;
  DOMAttrImpl *insertAttr;
  XMLAttDef *attr_1;
  XMLAttDefList *defAttrs;
  DOMNode *remAttr;
  DOMAttrImpl *attr;
  XMLCh *namespaceURI;
  uint attrURIId;
  XMLAttr *oneAttrib;
  XMLSize_t index;
  DOMElementImpl *elemImpl;
  undefined1 local_58 [8];
  XMLBufBid elemQName;
  DOMElement *elem;
  bool isRoot_local;
  bool isEmpty_local;
  XMLSize_t attrCount_local;
  RefVectorOf<xercesc_4_0::XMLAttr> *attrList_local;
  XMLCh *elemPrefix_local;
  uint urlId_local;
  XMLElementDecl *elemDecl_local;
  XSDDOMParser *this_local;
  undefined4 extraout_var_02;
  undefined4 extraout_var_05;
  
  this->fDepth = this->fDepth + 1;
  if (this->fAnnotationDepth == -1) {
    pXVar10 = XMLElementDecl::getBaseName(elemDecl);
    bVar4 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if (bVar4) {
      pXVar10 = XercesDOMParser::getURIText(&this->super_XercesDOMParser,urlId);
      bVar4 = XMLString::equals(pXVar10,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
      if (bVar4) {
        this->fAnnotationDepth = this->fDepth;
        startAnnotation(this,elemDecl,attrList,attrCount);
      }
    }
  }
  else {
    if (this->fDepth != this->fAnnotationDepth + 1) {
      startAnnotationElement(this,elemDecl,attrList,attrCount);
      if (!isEmpty) {
        return;
      }
      (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
        _vptr_XMLDocumentHandler[6])(this,elemDecl,(ulong)urlId,(ulong)isRoot,elemPrefix);
      return;
    }
    this->fInnerAnnotationDepth = this->fDepth;
    startAnnotationElement(this,elemDecl,attrList,attrCount);
  }
  uVar5 = XMLScanner::getEmptyNamespaceId
                    ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner);
  if (urlId == uVar5) {
    pXVar10 = XMLElementDecl::getBaseName(elemDecl);
    iVar6 = (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
              _vptr_XMLDocumentHandler[0x2f])(this,0,pXVar10);
    elemQName.fMgr = (XMLBufferMgr *)CONCAT44(extraout_var_01,iVar6);
  }
  else if ((elemPrefix == (XMLCh *)0x0) || (*elemPrefix == L'\0')) {
    pXVar10 = XMLScanner::getURIText
                        ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,urlId);
    pXVar11 = XMLElementDecl::getBaseName(elemDecl);
    iVar6 = (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
              _vptr_XMLDocumentHandler[0x2f])(this,pXVar10,pXVar11);
    elemQName.fMgr = (XMLBufferMgr *)CONCAT44(extraout_var_00,iVar6);
  }
  else {
    XMLBufBid::XMLBufBid
              ((XMLBufBid *)local_58,&(this->super_XercesDOMParser).super_AbstractDOMParser.fBufMgr)
    ;
    XMLBufBid::set((XMLBufBid *)local_58,elemPrefix,0);
    XMLBufBid::append((XMLBufBid *)local_58,L':');
    pXVar10 = XMLElementDecl::getBaseName(elemDecl);
    XMLBufBid::append((XMLBufBid *)local_58,pXVar10,0);
    pXVar10 = XMLScanner::getURIText
                        ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,urlId);
    pXVar11 = XMLBufBid::getRawBuffer((XMLBufBid *)local_58);
    iVar6 = (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
              _vptr_XMLDocumentHandler[0x2f])(this,pXVar10,pXVar11);
    elemQName.fMgr = (XMLBufferMgr *)CONCAT44(extraout_var,iVar6);
    XMLBufBid::~XMLBufBid((XMLBufBid *)local_58);
  }
  pXVar3 = elemQName.fMgr;
  for (oneAttrib = (XMLAttr *)0x0; oneAttrib < attrCount;
      oneAttrib = (XMLAttr *)&oneAttrib->field_0x1) {
    this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,(XMLSize_t)oneAttrib
                        );
    namespaceURI._4_4_ = XMLAttr::getURIId(this_00);
    attr = (DOMAttrImpl *)0x0;
    pXVar10 = XMLAttr::getName(this_00);
    bVar4 = XMLString::equals(pXVar10,(XMLCh *)XMLUni::fgXMLNSString);
    if (bVar4) {
      namespaceURI._4_4_ =
           XMLScanner::getXMLNSNamespaceId
                     ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner);
    }
    uVar5 = XMLScanner::getEmptyNamespaceId
                      ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner);
    if (namespaceURI._4_4_ != uVar5) {
      attr = (DOMAttrImpl *)
             XMLScanner::getURIText
                       ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,
                        namespaceURI._4_4_);
    }
    pDVar1 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
    pXVar10 = XMLAttr::getQName(this_00);
    iVar6 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])(pDVar1,attr,pXVar10);
    attr_00 = (DOMAttr *)CONCAT44(extraout_var_02,iVar6);
    pXVar10 = XMLAttr::getValue(this_00);
    (*(attr_00->super_DOMNode)._vptr_DOMNode[0x2b])(attr_00,pXVar10);
    plVar12 = (long *)(**(code **)(pXVar3->fBufCount + 0x1a0))(pXVar3,attr_00);
    if (plVar12 != (long *)0x0) {
      (**(code **)(*plVar12 + 0x138))();
    }
    AVar7 = XMLAttr::getType(this_00);
    if (AVar7 == ID) {
      if (((this->super_XercesDOMParser).super_AbstractDOMParser.fDocument)->fNodeIDMap ==
          (DOMNodeIDMap *)0x0) {
        this_01 = (DOMNodeIDMap *)
                  operator_new(0x30,(this->super_XercesDOMParser).super_AbstractDOMParser.fDocument)
        ;
        pDVar1 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
        local_180 = (DOMDocument *)0x0;
        if (pDVar1 != (DOMDocumentImpl *)0x0) {
          local_180 = &pDVar1->super_DOMDocument;
        }
        DOMNodeIDMap::DOMNodeIDMap(this_01,500,local_180);
        ((this->super_XercesDOMParser).super_AbstractDOMParser.fDocument)->fNodeIDMap = this_01;
      }
      DOMNodeIDMap::add(((this->super_XercesDOMParser).super_AbstractDOMParser.fDocument)->
                        fNodeIDMap,attr_00);
      DOMNodeImpl::isIdAttr((DOMNodeImpl *)(attr_00 + 3),true);
    }
    bVar4 = XMLAttr::getSpecified(this_00);
    (*(attr_00->super_DOMNode)._vptr_DOMNode[0x33])(attr_00,(ulong)bVar4);
  }
  uVar5 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])();
  if ((uVar5 & 1) != 0) {
    iVar6 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])();
    plVar12 = (long *)CONCAT44(extraout_var_03,iVar6);
    for (uStack_c0 = 0; uVar13 = (**(code **)(*plVar12 + 0x50))(), uStack_c0 < uVar13;
        uStack_c0 = uStack_c0 + 1) {
      this_02 = (XMLAttDef *)(**(code **)(*plVar12 + 0x58))(plVar12,uStack_c0);
      DVar8 = XMLAttDef::getDefaultType(this_02);
      if ((DVar8 == DefAttTypes_Min) || (DVar8 == Fixed)) {
        iVar6 = (*(this_02->super_XSerializable)._vptr_XSerializable[5])();
        bbPrefixQName.fMgr = (XMLBufferMgr *)CONCAT44(extraout_var_04,iVar6);
        XMLBufBid::XMLBufBid
                  ((XMLBufBid *)&prefixBuf,
                   &(this->super_XercesDOMParser).super_AbstractDOMParser.fBufMgr);
        _uriId = XMLBufBid::getBuffer((XMLBufBid *)&prefixBuf);
        namespaceURI_1._4_4_ = 0xffffffff;
        namespaceURI_1._0_4_ =
             XMLScanner::resolveQName
                       ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,
                        (XMLCh *)bbPrefixQName.fMgr,_uriId,Mode_Attribute,
                        (int *)((long)&namespaceURI_1 + 4));
        remAttr_1 = (DOMAttr *)0x0;
        bVar4 = XMLString::equals((XMLCh *)bbPrefixQName.fMgr,(XMLCh *)XMLUni::fgXMLNSString);
        if (bVar4) {
          namespaceURI_1._0_4_ =
               XMLScanner::getXMLNSNamespaceId
                         ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner);
        }
        uVar5 = (uint)namespaceURI_1;
        uVar9 = XMLScanner::getEmptyNamespaceId
                          ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner);
        if (uVar5 != uVar9) {
          remAttr_1 = (DOMAttr *)
                      XMLScanner::getURIText
                                ((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner,
                                 (uint)namespaceURI_1);
        }
        pDVar1 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
        iVar6 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                          (pDVar1,remAttr_1,bbPrefixQName.fMgr);
        plVar14 = (long *)CONCAT44(extraout_var_05,iVar6);
        plVar15 = (long *)(**(code **)(pXVar3->fBufCount + 0x248))(pXVar3,plVar14);
        if (plVar15 != (long *)0x0) {
          (**(code **)(*plVar15 + 0x138))();
        }
        pXVar10 = XMLAttDef::getValue(this_02);
        if (pXVar10 != (XMLCh *)0x0) {
          pXVar10 = XMLAttDef::getValue(this_02);
          (**(code **)(*plVar14 + 0x158))(plVar14,pXVar10);
          (**(code **)(*plVar14 + 0x198))(plVar14,0);
        }
        XMLBufBid::~XMLBufBid((XMLBufBid *)&prefixBuf);
      }
      (*(this_02->super_XSerializable)._vptr_XSerializable[6])();
    }
  }
  pDVar2 = (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent;
  (*pDVar2->_vptr_DOMNode[0x11])(pDVar2,elemQName.fMgr);
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent = (DOMNode *)elemQName.fMgr;
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode = (DOMNode *)elemQName.fMgr;
  (this->super_XercesDOMParser).super_AbstractDOMParser.fWithinElement = true;
  if (isEmpty) {
    (*(this->super_XercesDOMParser).super_AbstractDOMParser.super_XMLDocumentHandler.
      _vptr_XMLDocumentHandler[6])(this,elemDecl,(ulong)urlId,(ulong)isRoot,elemPrefix);
  }
  return;
}

Assistant:

void XSDDOMParser::startElement( const XMLElementDecl&       elemDecl
                               , const unsigned int          urlId
                               , const XMLCh* const          elemPrefix
                               , const RefVectorOf<XMLAttr>& attrList
                               , const XMLSize_t             attrCount
                               , const bool                  isEmpty
                               , const bool                  isRoot)
{
    fDepth++;

    // while it is true that non-whitespace character data
    // may only occur in appInfo or documentation
    // elements, it's certainly legal for comments and PI's to
    // occur as children of annotation; we need
    // to account for these here.
    if (fAnnotationDepth == -1)
    {
        if (XMLString::equals(elemDecl.getBaseName(), SchemaSymbols::fgELT_ANNOTATION) &&
            XMLString::equals(getURIText(urlId), SchemaSymbols::fgURI_SCHEMAFORSCHEMA))
        {

            fAnnotationDepth = fDepth;
            startAnnotation(elemDecl, attrList, attrCount);
        }
    }
    else if (fDepth == fAnnotationDepth+1)
    {
        fInnerAnnotationDepth = fDepth;
        startAnnotationElement(elemDecl, attrList, attrCount);
    }
    else
    {
        startAnnotationElement(elemDecl, attrList, attrCount);
        if(isEmpty)
            endElement(elemDecl, urlId, isRoot, elemPrefix);
        // avoid falling through; don't call startElement in this case
        return;
    }

    DOMElement *elem;
    if (urlId != fScanner->getEmptyNamespaceId())  //TagName has a prefix
    {
        if (elemPrefix && *elemPrefix)
        {
            XMLBufBid elemQName(&fBufMgr);
            elemQName.set(elemPrefix);
            elemQName.append(chColon);
            elemQName.append(elemDecl.getBaseName());
            elem = createElementNSNode(
                fScanner->getURIText(urlId), elemQName.getRawBuffer());
        }
        else {
            elem = createElementNSNode(
                fScanner->getURIText(urlId), elemDecl.getBaseName());
        }
    }
    else {
        elem = createElementNSNode(0, elemDecl.getBaseName());
    }

    DOMElementImpl *elemImpl = (DOMElementImpl *) elem;
    for (XMLSize_t index = 0; index < attrCount; ++index)
    {
        const XMLAttr* oneAttrib = attrList.elementAt(index);
        unsigned int attrURIId = oneAttrib->getURIId();
        const XMLCh* namespaceURI = 0;

        //for xmlns=...
        if (XMLString::equals(oneAttrib->getName(), XMLUni::fgXMLNSString))
            attrURIId = fScanner->getXMLNSNamespaceId();

        //TagName has a prefix
        if (attrURIId != fScanner->getEmptyNamespaceId())
            namespaceURI = fScanner->getURIText(attrURIId); //get namespaceURI

        //  revisit.  Optimize to init the named node map to the
        //            right size up front.
        DOMAttrImpl *attr = (DOMAttrImpl *)
            fDocument->createAttributeNS(namespaceURI, oneAttrib->getQName());
        attr->setValue(oneAttrib -> getValue());
        DOMNode* remAttr = elemImpl->setAttributeNodeNS(attr);
        if (remAttr)
            remAttr->release();

        // Attributes of type ID.  If this is one, add it to the hashtable of IDs
        //   that is constructed for use by GetElementByID().
        if (oneAttrib->getType()==XMLAttDef::ID)
        {
            if (fDocument->fNodeIDMap == 0)
                fDocument->fNodeIDMap = new (fDocument) DOMNodeIDMap(500, fDocument);
            fDocument->fNodeIDMap->add(attr);
            attr->fNode.isIdAttr(true);
        }

        attr->setSpecified(oneAttrib->getSpecified());
    }

    // set up the default attributes
    if (elemDecl.hasAttDefs())
	{
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;
        DOMAttrImpl * insertAttr = 0;

        for (XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);

            const XMLAttDef::DefAttTypes defType = attr->getDefaultType();
            if ((defType == XMLAttDef::Default)
            ||  (defType == XMLAttDef::Fixed))
            {
                // DOM Level 2 wants all namespace declaration attributes
                // to be bound to "http://www.w3.org/2000/xmlns/"
                // So as long as the XML parser doesn't do it, it needs to
                // done here.
                const XMLCh* qualifiedName = attr->getFullName();
                XMLBufBid bbPrefixQName(&fBufMgr);
                XMLBuffer& prefixBuf = bbPrefixQName.getBuffer();
                int colonPos = -1;
                unsigned int uriId = fScanner->resolveQName(qualifiedName, prefixBuf, ElemStack::Mode_Attribute, colonPos);

                const XMLCh* namespaceURI = 0;
                if (XMLString::equals(qualifiedName, XMLUni::fgXMLNSString))
                    uriId = fScanner->getXMLNSNamespaceId();

                //TagName has a prefix
                if (uriId != fScanner->getEmptyNamespaceId())
                    namespaceURI = fScanner->getURIText(uriId);

                insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(
                    namespaceURI, qualifiedName);

                DOMAttr* remAttr = elemImpl->setDefaultAttributeNodeNS(insertAttr);
                if (remAttr)
                    remAttr->release();

                if (attr->getValue() != 0)
                {
                    insertAttr->setValue(attr->getValue());
                    insertAttr->setSpecified(false);
                }
            }

            insertAttr = 0;
            attr->reset();
        }
    }

    fCurrentParent->appendChild(elem);
    fCurrentParent = elem;
    fCurrentNode = elem;
    fWithinElement = true;

    // If an empty element, do end right now (no endElement() will be called)
    if (isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}